

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void ec_pubkey_parse_pointtest(uchar *input,int xvalid,int yvalid)

{
  secp256k1_context *psVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  secp256k1_callback _saved_callback;
  int32_t _calls_to_callback;
  unsigned_long _zzq_result_10;
  unsigned_long _zzq_args_10 [6];
  unsigned_long _zzq_result_9;
  unsigned_long _zzq_args_9 [6];
  unsigned_long _zzq_result_8;
  unsigned_long _zzq_args_8 [6];
  unsigned_long _zzq_result_7;
  unsigned_long _zzq_args_7 [6];
  unsigned_long _zzq_result_6;
  unsigned_long _zzq_args_6 [6];
  unsigned_long _zzq_result_5;
  unsigned_long _zzq_args_5 [6];
  unsigned_long _zzq_result_4;
  unsigned_long _zzq_args_4 [6];
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_args_3 [6];
  unsigned_long _zzq_result_2;
  unsigned_long _zzq_args_2 [6];
  unsigned_long _zzq_result_1;
  unsigned_long _zzq_args_1 [6];
  size_t outl;
  uchar pubkeyo [65];
  int ysign;
  int ypass;
  int xpass;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  int32_t i;
  size_t pubkeyclen;
  secp256k1_ge ge;
  secp256k1_pubkey pubkey;
  uchar pubkeyc [65];
  undefined4 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbc;
  undefined1 in_stack_fffffffffffffbbd;
  undefined1 uVar3;
  undefined1 uVar4;
  secp256k1_context *ctx;
  secp256k1_context *ctx_00;
  size_t in_stack_fffffffffffffc10;
  undefined1 local_98 [64];
  undefined1 local_58;
  undefined1 auStack_57 [71];
  int local_10;
  int local_c;
  void *local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memcpy(auStack_57,in_RDI,0x40);
  local_58 = 0;
  uVar4 = 0;
  if (((local_c != 0) && (local_10 != 0)) && ((*(byte *)((long)local_8 + 0x3f) & 1) == 0xfffffffe))
  {
    in_stack_fffffffffffffbbd = 0;
  }
  uVar3 = 0;
  memset(local_98,0xfe,0x40);
  iVar2 = secp256k1_ec_pubkey_parse
                    ((secp256k1_context *)0x4d430001,(secp256k1_pubkey *)0x0,(uchar *)0x0,
                     in_stack_fffffffffffffc10);
  if (iVar2 == 0) {
    ctx = (secp256k1_context *)(CTX->illegal_callback).fn;
    ctx_00 = (secp256k1_context *)(CTX->illegal_callback).data;
    secp256k1_context_set_illegal_callback
              (ctx,(_func_void_char_ptr_void_ptr *)
                   CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffbbd,
                                                          CONCAT14(in_stack_fffffffffffffbbc,
                                                                   in_stack_fffffffffffffbb8)))),
               (void *)0x144f85);
    iVar2 = secp256k1_pubkey_load
                      (ctx_00,(secp256k1_ge *)ctx,
                       (secp256k1_pubkey *)
                       CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffbbd,
                                                              CONCAT14(in_stack_fffffffffffffbbc,
                                                                       in_stack_fffffffffffffbb8))))
                      );
    psVar1 = CTX;
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x166c,"test condition failed: (secp256k1_pubkey_load(CTX, &ge, &pubkey)) == 0");
      abort();
    }
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)ctx;
    (psVar1->illegal_callback).data = ctx_00;
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x166c,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c",
          0x166a,
          "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 0"
         );
  abort();
}

Assistant:

static void ec_pubkey_parse_pointtest(const unsigned char *input, int xvalid, int yvalid) {
    unsigned char pubkeyc[65];
    secp256k1_pubkey pubkey;
    secp256k1_ge ge;
    size_t pubkeyclen;

    for (pubkeyclen = 3; pubkeyclen <= 65; pubkeyclen++) {
        /* Smaller sizes are tested exhaustively elsewhere. */
        int32_t i;
        memcpy(&pubkeyc[1], input, 64);
        SECP256K1_CHECKMEM_UNDEFINE(&pubkeyc[pubkeyclen], 65 - pubkeyclen);
        for (i = 0; i < 256; i++) {
            /* Try all type bytes. */
            int xpass;
            int ypass;
            int ysign;
            pubkeyc[0] = i;
            /* What sign does this point have? */
            ysign = (input[63] & 1) + 2;
            /* For the current type (i) do we expect parsing to work? Handled all of compressed/uncompressed/hybrid. */
            xpass = xvalid && (pubkeyclen == 33) && ((i & 254) == 2);
            /* Do we expect a parse and re-serialize as uncompressed to give a matching y? */
            ypass = xvalid && yvalid && ((i & 4) == ((pubkeyclen == 65) << 2)) &&
                ((i == 4) || ((i & 251) == ysign)) && ((pubkeyclen == 33) || (pubkeyclen == 65));
            if (xpass || ypass) {
                /* These cases must parse. */
                unsigned char pubkeyo[65];
                size_t outl;
                memset(&pubkey, 0, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                outl = 65;
                SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
                SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                CHECK(outl == 33);
                CHECK(secp256k1_memcmp_var(&pubkeyo[1], &pubkeyc[1], 32) == 0);
                CHECK((pubkeyclen != 33) || (pubkeyo[0] == pubkeyc[0]));
                if (ypass) {
                    /* This test isn't always done because we decode with alternative signs, so the y won't match. */
                    CHECK(pubkeyo[0] == ysign);
                    CHECK(secp256k1_pubkey_load(CTX, &ge, &pubkey) == 1);
                    memset(&pubkey, 0, sizeof(pubkey));
                    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                    secp256k1_pubkey_save(&pubkey, &ge);
                    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                    outl = 65;
                    SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                    CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_UNCOMPRESSED) == 1);
                    SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                    CHECK(outl == 65);
                    CHECK(pubkeyo[0] == 4);
                    CHECK(secp256k1_memcmp_var(&pubkeyo[1], input, 64) == 0);
                }
            } else {
                /* These cases must fail to parse. */
                memset(&pubkey, 0xfe, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 0);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                CHECK_ILLEGAL(CTX, secp256k1_pubkey_load(CTX, &ge, &pubkey));
            }
        }
    }
}